

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_dsp_common.h
# Opt level: O2

uint16_t clip_pixel_highbd(int val,int bd)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint uVar3;
  
  if (bd == 10) {
    uVar3 = 0x3ff;
  }
  else if (bd == 0xc) {
    uVar3 = 0xfff;
  }
  else {
    uVar3 = 0xff;
  }
  uVar2 = (uint16_t)uVar3;
  if ((uint)val < uVar3) {
    uVar2 = (uint16_t)val;
  }
  uVar1 = 0;
  if (-1 < val) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

static inline uint16_t clip_pixel_highbd(int val, int bd) {
  switch (bd) {
    case 8:
    default: return (uint16_t)clamp(val, 0, 255);
    case 10: return (uint16_t)clamp(val, 0, 1023);
    case 12: return (uint16_t)clamp(val, 0, 4095);
  }
}